

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  complex<float> *pcVar5;
  long *in_RSI;
  TPZRegisterClassId *in_RDI;
  int64_t j;
  int64_t i;
  complex<float> *p;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  complex<float> *this_00;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffff70;
  complex<float> *pcVar6;
  int64_t in_stack_ffffffffffffff78;
  TPZManVector<int,_5> *in_stack_ffffffffffffff80;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (TPZMatrix<std::complex<float>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  if (*(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10) != 0) {
    uVar3 = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar4);
    if (uVar3 != 0) {
      pcVar6 = pcVar5 + uVar3;
      this_00 = pcVar5;
      do {
        std::complex<float>::complex(this_00,0.0,0.0);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar6);
    }
    *(complex<float> **)(in_RDI + 0x20) = pcVar5;
    local_38 = *(undefined8 **)(in_RDI + 0x20);
    for (local_48 = 0; local_48 < *(long *)(in_RDI + 0x10); local_48 = local_48 + 1) {
      for (local_40 = 0; local_40 < *(long *)(in_RDI + 8); local_40 = local_40 + 1) {
        uVar2 = (**(code **)(*in_RSI + 0x120))(in_RSI,local_40,local_48);
        *local_38 = uVar2;
        local_38 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZMatrix<TVar> &mat) : 
TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>(mat), fElem(0),fGiven(0),fSize(0) {
    if(this->fRow*this->fCol) {
        
        fElem = new TVar[this->fRow*this->fCol];
        TVar * p = fElem;
        int64_t i,j;
        for(j=0; j<this->fCol; j++) {
            for(i=0; i<this->fRow; i++) {
                *p++ = mat.GetVal(i,j);
            }
        }
    }
}